

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O3

uint __thiscall
RealtimeHelper::getPlayingNotes(RealtimeHelper *this,uint partNumber,Bit8u *keys,Bit8u *velocities)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = 0;
  LOCK();
  bVar2 = (this->stateSnapshotMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p ==
          (__pointer_type)0x0;
  if (bVar2) {
    (this->stateSnapshotMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
  }
  UNLOCK();
  if (!bVar2) {
    QBasicMutex::lockInternal();
  }
  if (this->qsynth->state == SynthState_OPEN) {
    uVar1 = (this->stateSnapshot).partStates[partNumber].playingNotesCount;
    memcpy(keys,(this->stateSnapshot).partStates[partNumber].keysOfPlayingNotes,(ulong)uVar1);
    memcpy(velocities,(this->stateSnapshot).partStates[partNumber].velocitiesOfPlayingNotes,
           (ulong)uVar1);
  }
  LOCK();
  bVar2 = (this->stateSnapshotMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p ==
          (__pointer_type)0x1;
  if (bVar2) {
    (this->stateSnapshotMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  }
  UNLOCK();
  if (!bVar2) {
    QBasicMutex::unlockInternal();
  }
  return uVar1;
}

Assistant:

uint getPlayingNotes(uint partNumber, Bit8u *keys, Bit8u *velocities) {
		QMutexLocker stateSnapshotLocker(&stateSnapshotMutex);
		if (!qsynth.isOpen()) return 0;
		Bit32u playingNotesCount = stateSnapshot.partStates[partNumber].playingNotesCount;
		memcpy(keys, stateSnapshot.partStates[partNumber].keysOfPlayingNotes, playingNotesCount * sizeof(Bit8u));
		memcpy(velocities, stateSnapshot.partStates[partNumber].velocitiesOfPlayingNotes, playingNotesCount * sizeof(Bit8u));
		return playingNotesCount;
	}